

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_d2i_fp.cc
# Opt level: O0

void * ASN1_item_d2i_bio(ASN1_ITEM *it,BIO *in,void *x)

{
  int iVar1;
  ASN1_ITEM *pAVar2;
  void *ret;
  uint8_t *ptr;
  size_t len;
  uint8_t *data;
  void *x_local;
  BIO *in_local;
  ASN1_ITEM *it_local;
  
  data = (uint8_t *)x;
  x_local = in;
  in_local = (BIO *)it;
  iVar1 = BIO_read_asn1((BIO *)in,(uint8_t **)&len,(size_t *)&ptr,0x7fffffff);
  if (iVar1 == 0) {
    it_local = (ASN1_ITEM *)0x0;
  }
  else {
    ret = (void *)len;
    pAVar2 = (ASN1_ITEM *)
             ASN1_item_d2i((ASN1_VALUE **)data,(uchar **)&ret,(long)ptr,(ASN1_ITEM *)in_local);
    OPENSSL_free((void *)len);
    it_local = pAVar2;
  }
  return it_local;
}

Assistant:

void *ASN1_item_d2i_bio(const ASN1_ITEM *it, BIO *in, void *x) {
  uint8_t *data;
  size_t len;
  // Historically, this function did not impose a limit in OpenSSL and is used
  // to read CRLs, so we leave this without an external bound.
  if (!BIO_read_asn1(in, &data, &len, INT_MAX)) {
    return NULL;
  }
  const uint8_t *ptr = data;
  void *ret = ASN1_item_d2i(reinterpret_cast<ASN1_VALUE **>(x), &ptr, len, it);
  OPENSSL_free(data);
  return ret;
}